

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

TestCaseGroup * vkt::image::createImageQualifiersTests(TestContext *testCtx)

{
  ImageType imageType_00;
  undefined8 uVar1;
  int iVar2;
  TestCaseGroup *pTVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  char *name;
  MemoryQualifierTestCase *this;
  ImageType imageType_01;
  ImageType imageType_02;
  TextureFormat *extraout_RDX;
  TextureFormat *format_00;
  TextureFormat *extraout_RDX_00;
  char *local_198;
  char *local_190;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  string formatName;
  TextureFormat *format;
  deInt32 formatNdx;
  undefined1 local_108 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTypeGroup;
  undefined1 local_d8 [8];
  MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> restrictCase;
  UVec3 imageSize;
  ImageType imageType;
  deInt32 imageTypeNdx;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> qualifierGroup;
  char *memoryQualifierName;
  Qualifier memoryQualifier;
  deUint32 qualifierI;
  Vector<unsigned_int,_3> local_84;
  Vector<unsigned_int,_3> local_78;
  Vector<unsigned_int,_3> local_6c;
  Vector<unsigned_int,_3> local_60;
  Vector<unsigned_int,_3> local_54;
  Vector<unsigned_int,_3> local_48;
  Vector<unsigned_int,_3> local_3c;
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageQualifiersTests;
  TestContext *testCtx_local;
  
  imageQualifiersTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  .m_data._8_8_ = testCtx;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,(TestContext *)
                    imageQualifiersTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"qualifiers","Coherent, volatile and restrict");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  if ((createImageQualifiersTests(tcu::TestContext&)::imageParamsArray == '\0') &&
     (iVar2 = __cxa_guard_acquire(&createImageQualifiersTests(tcu::TestContext&)::imageParamsArray),
     iVar2 != 0)) {
    tcu::Vector<unsigned_int,_3>::Vector(&local_3c,0x40,1,1);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray,IMAGE_TYPE_1D,&local_3c);
    tcu::Vector<unsigned_int,_3>::Vector(&local_48,0x40,1,8);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray + 1,IMAGE_TYPE_1D_ARRAY,&local_48);
    tcu::Vector<unsigned_int,_3>::Vector(&local_54,0x40,0x40,1);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray + 2,IMAGE_TYPE_2D,&local_54);
    tcu::Vector<unsigned_int,_3>::Vector(&local_60,0x40,0x40,8);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray + 3,IMAGE_TYPE_2D_ARRAY,&local_60);
    tcu::Vector<unsigned_int,_3>::Vector(&local_6c,0x40,0x40,8);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray + 4,IMAGE_TYPE_3D,&local_6c);
    tcu::Vector<unsigned_int,_3>::Vector(&local_78,0x40,0x40,1);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray + 5,IMAGE_TYPE_CUBE,&local_78);
    tcu::Vector<unsigned_int,_3>::Vector(&local_84,0x40,0x40,2);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray + 6,IMAGE_TYPE_CUBE_ARRAY,&local_84);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)&memoryQualifier,0x40,1,1);
    createImageQualifiersTests(tcu::TestContext&)::ImageParams::ImageParams(vkt::image::
    ImageType,tcu::Vector<unsigned_int,3>_const__
              (createImageQualifiersTests::imageParamsArray + 7,IMAGE_TYPE_BUFFER,
               (UVec3 *)&memoryQualifier);
    __cxa_guard_release(&createImageQualifiersTests(tcu::TestContext&)::imageParamsArray);
  }
  if ((createImageQualifiersTests(tcu::TestContext&)::formats == '\0') &&
     (iVar2 = __cxa_guard_acquire(&createImageQualifiersTests(tcu::TestContext&)::formats),
     iVar2 != 0)) {
    tcu::TextureFormat::TextureFormat(createImageQualifiersTests::formats,R,FLOAT);
    tcu::TextureFormat::TextureFormat(createImageQualifiersTests::formats + 1,R,UNSIGNED_INT32);
    tcu::TextureFormat::TextureFormat(createImageQualifiersTests::formats + 2,R,SIGNED_INT32);
    __cxa_guard_release(&createImageQualifiersTests(tcu::TestContext&)::formats);
  }
  for (memoryQualifierName._4_4_ = QUALIFIER_COHERENT; memoryQualifierName._4_4_ < QUALIFIER_LAST;
      memoryQualifierName._4_4_ = memoryQualifierName._4_4_ + QUALIFIER_VOLATILE) {
    if (memoryQualifierName._4_4_ == QUALIFIER_COHERENT) {
      local_190 = "coherent";
    }
    else {
      if (memoryQualifierName._4_4_ == QUALIFIER_VOLATILE) {
        local_198 = "volatile";
      }
      else {
        local_198 = (char *)0x0;
        if (memoryQualifierName._4_4_ == QUALIFIER_RESTRICT) {
          local_198 = "restrict";
        }
      }
      local_190 = local_198;
    }
    qualifierGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data._8_8_ = local_190;
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar3,(TestContext *)
                      imageQualifiersTests.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,
               (char *)qualifierGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,"");
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&imageType + 3));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&imageTypeNdx
               ,pTVar3);
    for (imageSize.m_data[2] = 0; (int)imageSize.m_data[2] < 8;
        imageSize.m_data[2] = imageSize.m_data[2] + 1) {
      imageType_00 = createImageQualifiersTests::imageParamsArray[(int)imageSize.m_data[2]].
                     m_imageType;
      tcu::Vector<unsigned_int,_3>::Vector
                ((Vector<unsigned_int,_3> *)
                 &restrictCase.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.
                  m_data.field_0x8,
                 &createImageQualifiersTests::imageParamsArray[(int)imageSize.m_data[2]].m_imageSize
                );
      uVar1 = imageQualifiersTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _8_8_;
      if (memoryQualifierName._4_4_ == QUALIFIER_RESTRICT) {
        getImageTypeName_abi_cxx11_
                  ((string *)
                   &imageTypeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0x8,(image *)(ulong)imageType_00,imageType_01);
        createImageQualifierRestrictCase
                  ((MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *)local_d8,
                   (TestContext *)uVar1,imageType_00,
                   (string *)
                   &imageTypeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0x8);
        std::__cxx11::string::~string
                  ((string *)
                   &imageTypeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0x8);
        pTVar4 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&imageTypeNdx)->super_TestNode;
        pTVar5 = (TestNode *)
                 de::details::MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>::release
                           ((MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *)local_d8);
        tcu::TestNode::addChild(pTVar4,pTVar5);
        de::details::MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>::~MovePtr
                  ((MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *)local_d8);
      }
      else {
        pTVar3 = (TestCaseGroup *)operator_new(0x70);
        uVar1 = imageQualifiersTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        format._7_1_ = 1;
        getImageTypeName_abi_cxx11_((string *)&formatNdx,(image *)(ulong)imageType_00,imageType_02);
        name = (char *)std::__cxx11::string::c_str();
        tcu::TestCaseGroup::TestCaseGroup(pTVar3,(TestContext *)uVar1,name,"");
        format._7_1_ = 0;
        de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                  ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&format + 6));
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_108
                   ,pTVar3);
        std::__cxx11::string::~string((string *)&formatNdx);
        format_00 = extraout_RDX;
        for (format._0_4_ = 0; (int)format < 3; format._0_4_ = (int)format + 1) {
          formatName.field_2._8_8_ = createImageQualifiersTests::formats + (int)format;
          getShaderImageFormatQualifier_abi_cxx11_
                    ((string *)local_158,
                     (image *)(createImageQualifiersTests::formats + (int)format),format_00);
          pTVar4 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)local_108)->super_TestNode;
          this = (MemoryQualifierTestCase *)operator_new(0x90);
          uVar1 = imageQualifiersTests.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_179);
          anon_unknown_0::MemoryQualifierTestCase::MemoryQualifierTestCase
                    (this,(TestContext *)uVar1,(string *)local_158,&local_178,
                     memoryQualifierName._4_4_,imageType_00,
                     (UVec3 *)&restrictCase.
                               super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.
                               m_data.field_0x8,(TextureFormat *)formatName.field_2._8_8_,
                     GLSL_VERSION_440);
          tcu::TestNode::addChild(pTVar4,(TestNode *)this);
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator(&local_179);
          std::__cxx11::string::~string((string *)local_158);
          format_00 = extraout_RDX_00;
        }
        pTVar4 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&imageTypeNdx)->super_TestNode;
        pTVar5 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                  ::release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                            local_108)->super_TestNode;
        tcu::TestNode::addChild(pTVar4,pTVar5);
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_108
                  );
      }
    }
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    pTVar5 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      &imageTypeNdx)->super_TestNode;
    tcu::TestNode::addChild(pTVar4,pTVar5);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&imageTypeNdx
              );
  }
  pTVar3 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createImageQualifiersTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> imageQualifiersTests(new tcu::TestCaseGroup(testCtx, "qualifiers", "Coherent, volatile and restrict"));

	struct ImageParams
	{
		ImageParams(const ImageType imageType, const tcu::UVec3& imageSize)
			: m_imageType	(imageType)
			, m_imageSize	(imageSize)
		{
		}
		ImageType	m_imageType;
		tcu::UVec3	m_imageSize;
	};

	static const ImageParams imageParamsArray[] =
	{
		ImageParams(IMAGE_TYPE_1D,			tcu::UVec3(64u, 1u,  1u)),
		ImageParams(IMAGE_TYPE_1D_ARRAY,	tcu::UVec3(64u, 1u,  8u)),
		ImageParams(IMAGE_TYPE_2D,			tcu::UVec3(64u, 64u, 1u)),
		ImageParams(IMAGE_TYPE_2D_ARRAY,	tcu::UVec3(64u, 64u, 8u)),
		ImageParams(IMAGE_TYPE_3D,			tcu::UVec3(64u, 64u, 8u)),
		ImageParams(IMAGE_TYPE_CUBE,		tcu::UVec3(64u, 64u, 1u)),
		ImageParams(IMAGE_TYPE_CUBE_ARRAY,	tcu::UVec3(64u, 64u, 2u)),
		ImageParams(IMAGE_TYPE_BUFFER,		tcu::UVec3(64u, 1u,  1u))
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::SIGNED_INT32),
	};

	for (deUint32 qualifierI = 0; qualifierI < MemoryQualifierTestCase::QUALIFIER_LAST; ++qualifierI)
	{
		const MemoryQualifierTestCase::Qualifier	memoryQualifier		= (MemoryQualifierTestCase::Qualifier)qualifierI;
		const char* const							memoryQualifierName =
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_COHERENT ? "coherent" :
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_VOLATILE ? "volatile" :
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_RESTRICT ? "restrict" :
			DE_NULL;

		de::MovePtr<tcu::TestCaseGroup> qualifierGroup(new tcu::TestCaseGroup(testCtx, memoryQualifierName, ""));

		for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParamsArray); imageTypeNdx++)
		{
			const ImageType		imageType = imageParamsArray[imageTypeNdx].m_imageType;
			const tcu::UVec3	imageSize = imageParamsArray[imageTypeNdx].m_imageSize;

			if (memoryQualifier == MemoryQualifierTestCase::QUALIFIER_RESTRICT)
			{
				de::MovePtr<TestCase> restrictCase = createImageQualifierRestrictCase(testCtx, imageType, getImageTypeName(imageType));
				qualifierGroup->addChild(restrictCase.release());
			}
			else
			{
				de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(imageType).c_str(), ""));

				for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format		= formats[formatNdx];
					const std::string			formatName	= getShaderImageFormatQualifier(formats[formatNdx]);

					imageTypeGroup->addChild(
						new MemoryQualifierTestCase(testCtx, formatName, "", memoryQualifier, imageType, imageSize, format, glu::GLSL_VERSION_440));
				}

				qualifierGroup->addChild(imageTypeGroup.release());
			}
		}

		imageQualifiersTests->addChild(qualifierGroup.release());
	}

	return imageQualifiersTests.release();
}